

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
::begin(iterator *__return_storage_ptr__,
       unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
       *this)

{
  char16_t *pcVar1;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  last;
  code_point cVar2;
  
  pcVar1 = (this->first_)._M_current;
  last._M_current = (this->last_)._M_current;
  (__return_storage_ptr__->next_chars_).chars_ = (_Type)0x0;
  (__return_storage_ptr__->next_chars_).size_ = 0;
  (__return_storage_ptr__->first_)._M_current = pcVar1;
  (__return_storage_ptr__->last_)._M_current = last._M_current;
  __return_storage_ptr__->idx_ = '\0';
  if (pcVar1 != last._M_current) {
    cVar2 = utf_traits<char16_t,2>::
            decode<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                      (&__return_storage_ptr__->first_,last);
    __return_storage_ptr__->next_chars_ =
         (encoded_chars<char32_t>)((ulong)(uint)cVar2 | 0x100000000);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr iterator begin() const { return iterator{first_, last_}; }